

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# name.h
# Opt level: O3

void __thiscall
APowerIronFeet::AbsorbDamage(APowerIronFeet *this,int damage,FName *damageType,int *newdamage)

{
  AInventory *pAVar1;
  
  if (damageType->Index == 0xbf) {
    *newdamage = 0;
    return;
  }
  pAVar1 = (this->super_APowerup).super_AInventory.super_AActor.Inventory.field_0.p;
  if (pAVar1 != (AInventory *)0x0) {
    if ((*(byte *)((long)&(pAVar1->super_AActor).super_DThinker + 0x20) & 0x20) != 0) {
      (this->super_APowerup).super_AInventory.super_AActor.Inventory.field_0.p = (AInventory *)0x0;
      return;
    }
    (**(code **)(*(long *)&(pAVar1->super_AActor).super_DThinker + 0x158))(pAVar1);
  }
  return;
}

Assistant:

bool operator == (ENamedName index) const { return Index == index; }